

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  pointer pbVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_00;
  ostream *os;
  cmGlobalNinjaGenerator *pcVar3;
  cmGeneratorTarget *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  TargetType TVar8;
  string *psVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Rb_tree_node_base *p_Var10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer puVar11;
  pointer puVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_3;
  pointer pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_> tg;
  cmNinjaBuild phonyAlias;
  string local_200;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [216];
  undefined1 local_e8 [56];
  undefined1 local_b0 [16];
  char *local_a0;
  size_type local_98;
  char local_90;
  undefined7 uStack_8f;
  _Base_ptr p_Stack_88;
  char *local_80;
  size_type local_78;
  char local_70;
  undefined7 uStack_6f;
  _Base_ptr p_Stack_68;
  char *local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  _Base_ptr p_Stack_48;
  pointer local_40;
  pointer local_38;
  
  psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmOutputConverter::MaybeRelativeToTopBinDir((string *)local_1c0,(cmOutputConverter *)this,psVar9);
  std::__cxx11::string::operator=((string *)&this->HomeRelativeOutputPath,(string *)local_1c0);
  if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  iVar7 = std::__cxx11::string::compare((char *)&this->HomeRelativeOutputPath);
  if (iVar7 == 0) {
    (this->HomeRelativeOutputPath)._M_string_length = 0;
    *(this->HomeRelativeOutputPath)._M_dataplus._M_p = '\0';
  }
  iVar7 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar7 != '\0') {
    pbVar1 = (this->super_cmLocalCommonGenerator).ConfigNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar13 = (this->super_cmLocalCommonGenerator).ConfigNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
        pbVar13 = pbVar13 + 1) {
      pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
      iVar7 = (*pcVar2->_vptr_cmGlobalGenerator[0x45])(pcVar2,pbVar13);
      WriteProcessedMakefile(this,(ostream *)CONCAT44(extraout_var,iVar7));
    }
  }
  iVar7 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x48])();
  WriteProcessedMakefile(this,(ostream *)CONCAT44(extraout_var_00,iVar7));
  bVar6 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar6) {
    WriteBuildFileTop(this);
    WritePools(this,(ostream *)
                    (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                    ProjectMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_1c0._0_8_ = local_1c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,"CMAKE_CL_SHOWINCLUDES_PREFIX","");
    psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)local_1c0);
    if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
      operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
    }
    if (psVar9->_M_string_length != 0) {
      os = (ostream *)
           (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].ProjectMap
           ._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_1c0._0_8_ = local_1c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"localized /showIncludes string","");
      cmGlobalNinjaGenerator::WriteComment(os,(string *)local_1c0);
      if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
        operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                 ProjectMap._M_t._M_impl.super__Rb_tree_header._M_node_count,"msvc_deps_prefix = ",
                 0x13);
      cmGeneratedFileStream::WriteAltEncoding
                ((cmGeneratedFileStream *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                 ProjectMap._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar9,ConsoleOutput);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                 ProjectMap._M_t._M_impl.super__Rb_tree_header._M_node_count,"\n\n",2);
    }
  }
  puVar12 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar11) {
    local_1e0._16_8_ = local_e8;
    local_1e0._8_8_ = local_b0;
    local_1e0._24_8_ = local_1c0 + 0x88;
    local_40 = puVar11;
    do {
      bVar6 = cmGeneratorTarget::IsInBuildSystem
                        ((puVar12->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (bVar6) {
        cmNinjaTargetGenerator::New
                  ((cmNinjaTargetGenerator *)local_1e0,
                   (puVar12->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if ((_func_int **)local_1e0._0_8_ != (_func_int **)0x0) {
          bVar6 = cmTarget::IsPerConfig
                            (((puVar12->_M_t).
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                              .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl)->
                             Target);
          uVar5 = local_1e0._0_8_;
          if (bVar6) {
            pbVar13 = (this->super_cmLocalCommonGenerator).ConfigNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_38 = (this->super_cmLocalCommonGenerator).ConfigNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (pbVar13 != local_38) {
              do {
                (**(code **)(*(_func_int **)local_1e0._0_8_ + 0x20))(local_1e0._0_8_,pbVar13);
                TVar8 = cmGeneratorTarget::GetType
                                  ((puVar12->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
                if ((TVar8 == GLOBAL_TARGET) &&
                   (iVar7 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                              GlobalGenerator)->_vptr_cmGlobalGenerator[0x28])(),
                   (char)iVar7 != '\0')) {
                  local_60 = &local_50;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"phony","");
                  local_1c0._0_8_ = local_1c0 + 0x10;
                  local_1c0._8_8_ = (pointer)0x0;
                  local_1c0[0x10] = '\0';
                  local_1c0._32_8_ = local_1c0 + 0x30;
                  if (local_60 == &local_50) {
                    local_1c0._56_8_ = p_Stack_48;
                  }
                  else {
                    local_1c0._32_8_ = local_60;
                  }
                  local_1c0._49_7_ = uStack_4f;
                  local_1c0[0x30] = local_50;
                  local_1c0._40_8_ = local_58;
                  local_58 = 0;
                  local_50 = '\0';
                  local_e8._0_4_ = _S_red;
                  local_e8._8_8_ = (_Base_ptr)0x0;
                  local_60 = &local_50;
                  memset((cmNinjaDeps *)(local_1c0 + 0x40),0,0x90);
                  local_e8._16_8_ = local_1e0._16_8_;
                  local_e8._24_8_ = local_1e0._16_8_;
                  local_e8._32_8_ = 0;
                  local_e8._40_8_ = local_1e0._8_8_;
                  local_e8._48_8_ = 0;
                  local_b0[0] = '\0';
                  pcVar3 = (cmGlobalNinjaGenerator *)
                           (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           GlobalGenerator;
                  pcVar4 = (puVar12->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
                  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
                  cmGlobalNinjaGenerator::AppendTargetOutputs
                            (pcVar3,pcVar4,(cmNinjaDeps *)(local_1c0 + 0x40),&local_200,
                             DependOnTargetArtifact);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_200._M_dataplus._M_p != &local_200.field_2) {
                    operator_delete(local_200._M_dataplus._M_p,
                                    local_200.field_2._M_allocated_capacity + 1);
                  }
                  cmGlobalNinjaGenerator::AppendTargetOutputs
                            ((cmGlobalNinjaGenerator *)
                             (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                             GlobalGenerator,
                             (puVar12->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                             (cmNinjaDeps *)local_1e0._24_8_,pbVar13,DependOnTargetArtifact);
                  pcVar3 = (cmGlobalNinjaGenerator *)
                           (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           GlobalGenerator;
                  iVar7 = (*(pcVar3->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                            _vptr_cmGlobalGenerator[0x46])(pcVar3,pbVar13);
                  cmGlobalNinjaGenerator::WriteBuild
                            (pcVar3,(ostream *)CONCAT44(extraout_var_01,iVar7),
                             (cmNinjaBuild *)local_1c0,0,(bool *)0x0);
                  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_1c0);
                }
                pbVar13 = pbVar13 + 1;
              } while (pbVar13 != local_38);
            }
            TVar8 = cmGeneratorTarget::GetType
                              ((puVar12->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            puVar11 = local_40;
            if ((TVar8 == GLOBAL_TARGET) &&
               (iVar7 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          GlobalGenerator)->_vptr_cmGlobalGenerator[0x28])(), (char)iVar7 != '\0'))
            {
              if ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                  CurrentConfigureMakefile != (cmMakefile *)0x0) {
                local_80 = &local_70;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"phony","");
                local_1c0._0_8_ = local_1c0 + 0x10;
                local_1c0._8_8_ = (pointer)0x0;
                local_1c0[0x10] = '\0';
                local_1c0._32_8_ = local_1c0 + 0x30;
                if (local_80 == &local_70) {
                  local_1c0._56_8_ = p_Stack_68;
                }
                else {
                  local_1c0._32_8_ = local_80;
                }
                local_1c0._49_7_ = uStack_6f;
                local_1c0[0x30] = local_70;
                local_1c0._40_8_ = local_78;
                local_78 = 0;
                local_70 = '\0';
                local_e8._0_4_ = _S_red;
                local_e8._8_8_ = (_Base_ptr)0x0;
                local_80 = &local_70;
                memset(local_1c0 + 0x40,0,0x90);
                local_e8._16_8_ = local_1e0._16_8_;
                local_e8._24_8_ = local_1e0._16_8_;
                local_e8._32_8_ = 0;
                local_e8._40_8_ = local_1e0._8_8_;
                local_e8._48_8_ = 0;
                local_b0[0] = '\0';
                pcVar3 = (cmGlobalNinjaGenerator *)
                         (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                ;
                pcVar4 = (puVar12->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
                local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
                cmGlobalNinjaGenerator::AppendTargetOutputs
                          (pcVar3,pcVar4,(cmNinjaDeps *)(local_1c0 + 0x40),&local_200,
                           DependOnTargetArtifact);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._M_dataplus._M_p != &local_200.field_2) {
                  operator_delete(local_200._M_dataplus._M_p,
                                  local_200.field_2._M_allocated_capacity + 1);
                }
                pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                ;
                for (p_Var10 = (_Rb_tree_node_base *)
                               pcVar2[1].LocalGenerators.
                               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    p_Var10 != (_Rb_tree_node_base *)&pcVar2[1].LocalGenerators;
                    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
                  cmGlobalNinjaGenerator::AppendTargetOutputs
                            ((cmGlobalNinjaGenerator *)
                             (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                             GlobalGenerator,
                             (puVar12->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                             (cmNinjaDeps *)local_1e0._24_8_,(string *)(p_Var10 + 1),
                             DependOnTargetArtifact);
                }
                pcVar3 = (cmGlobalNinjaGenerator *)
                         (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                ;
                iVar7 = (*(pcVar3->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          _vptr_cmGlobalGenerator[0x47])(pcVar3);
                cmGlobalNinjaGenerator::WriteBuild
                          (pcVar3,(ostream *)CONCAT44(extraout_var_02,iVar7),
                           (cmNinjaBuild *)local_1c0,0,(bool *)0x0);
                cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_1c0);
              }
              local_a0 = &local_90;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"phony","");
              local_1c0._0_8_ = local_1c0 + 0x10;
              local_1c0._8_8_ = (pointer)0x0;
              local_1c0[0x10] = '\0';
              local_1c0._32_8_ = local_1c0 + 0x30;
              if (local_a0 == &local_90) {
                local_1c0._56_8_ = p_Stack_88;
              }
              else {
                local_1c0._32_8_ = local_a0;
              }
              local_1c0._49_7_ = uStack_8f;
              local_1c0[0x30] = local_90;
              local_1c0._40_8_ = local_98;
              local_98 = 0;
              local_90 = '\0';
              local_e8._0_4_ = _S_red;
              local_e8._8_8_ = (_Base_ptr)0x0;
              local_a0 = &local_90;
              memset(local_1c0 + 0x40,0,0x90);
              local_e8._16_8_ = local_1e0._16_8_;
              local_e8._24_8_ = local_1e0._16_8_;
              local_e8._32_8_ = 0;
              local_e8._40_8_ = local_1e0._8_8_;
              local_e8._48_8_ = 0;
              local_b0[0] = '\0';
              pcVar3 = (cmGlobalNinjaGenerator *)
                       (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
              pcVar4 = (puVar12->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
              local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"all","");
              cmGlobalNinjaGenerator::AppendTargetOutputs
                        (pcVar3,pcVar4,(cmNinjaDeps *)(local_1c0 + 0x40),&local_200,
                         DependOnTargetArtifact);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p,
                                local_200.field_2._M_allocated_capacity + 1);
              }
              pbVar1 = (this->super_cmLocalCommonGenerator).ConfigNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar13 = (this->super_cmLocalCommonGenerator).ConfigNames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
                  pbVar13 = pbVar13 + 1) {
                cmGlobalNinjaGenerator::AppendTargetOutputs
                          ((cmGlobalNinjaGenerator *)
                           (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           GlobalGenerator,
                           (puVar12->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                           (cmNinjaDeps *)local_1e0._24_8_,pbVar13,DependOnTargetArtifact);
              }
              pcVar3 = (cmGlobalNinjaGenerator *)
                       (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
              iVar7 = (*(pcVar3->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                        _vptr_cmGlobalGenerator[0x47])(pcVar3);
              cmGlobalNinjaGenerator::WriteBuild
                        (pcVar3,(ostream *)CONCAT44(extraout_var_03,iVar7),(cmNinjaBuild *)local_1c0
                         ,0,(bool *)0x0);
              cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_1c0);
            }
          }
          else {
            local_1c0._0_8_ = local_1c0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"");
            (**(code **)(*(_func_int **)uVar5 + 0x20))(uVar5,(string *)local_1c0);
            if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
              operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1
                             );
            }
          }
        }
        if ((_func_int **)local_1e0._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_1e0._0_8_ + 8))();
        }
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar11);
  }
  pbVar1 = (this->super_cmLocalCommonGenerator).ConfigNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar13 = (this->super_cmLocalCommonGenerator).ConfigNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1; pbVar13 = pbVar13 + 1
      ) {
    WriteCustomCommandBuildStatements(this,pbVar13);
    AdditionalCleanFiles(this,pbVar13);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath =
    this->MaybeRelativeToTopBinDir(this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }

  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    for (auto const& config : this->GetConfigNames()) {
      this->WriteProcessedMakefile(this->GetImplFileStream(config));
    }
  }
  this->WriteProcessedMakefile(this->GetCommonFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string& showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream() << "msvc_deps_prefix = ";
      // 'cl /showIncludes' encodes output in the console output code page.
      // It may differ from the encoding used for file paths in 'build.ninja'.
      // Ninja matches the showIncludes prefix using its raw byte sequence.
      this->GetRulesFileStream().WriteAltEncoding(
        showIncludesPrefix, cmGeneratedFileStream::Encoding::ConsoleOutput);
      this->GetRulesFileStream() << "\n\n";
    }
  }

  for (const auto& target : this->GetGeneratorTargets()) {
    if (!target->IsInBuildSystem()) {
      continue;
    }
    auto tg = cmNinjaTargetGenerator::New(target.get());
    if (tg) {
      if (target->Target->IsPerConfig()) {
        for (auto const& config : this->GetConfigNames()) {
          tg->Generate(config);
          if (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
              this->GetGlobalGenerator()->IsMultiConfig()) {
            cmNinjaBuild phonyAlias("phony");
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.Outputs, "", DependOnTargetArtifact);
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.ExplicitDeps, config,
              DependOnTargetArtifact);
            this->GetGlobalNinjaGenerator()->WriteBuild(
              *this->GetGlobalNinjaGenerator()->GetConfigFileStream(config),
              phonyAlias);
          }
        }
        if (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
            this->GetGlobalGenerator()->IsMultiConfig()) {
          if (!this->GetGlobalNinjaGenerator()->GetDefaultConfigs().empty()) {
            cmNinjaBuild phonyAlias("phony");
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.Outputs, "", DependOnTargetArtifact);
            for (auto const& config :
                 this->GetGlobalNinjaGenerator()->GetDefaultConfigs()) {
              this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
                target.get(), phonyAlias.ExplicitDeps, config,
                DependOnTargetArtifact);
            }
            this->GetGlobalNinjaGenerator()->WriteBuild(
              *this->GetGlobalNinjaGenerator()->GetDefaultFileStream(),
              phonyAlias);
          }
          cmNinjaBuild phonyAlias("phony");
          this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
            target.get(), phonyAlias.Outputs, "all", DependOnTargetArtifact);
          for (auto const& config : this->GetConfigNames()) {
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.ExplicitDeps, config,
              DependOnTargetArtifact);
          }
          this->GetGlobalNinjaGenerator()->WriteBuild(
            *this->GetGlobalNinjaGenerator()->GetDefaultFileStream(),
            phonyAlias);
        }
      } else {
        tg->Generate("");
      }
    }
  }

  for (auto const& config : this->GetConfigNames()) {
    this->WriteCustomCommandBuildStatements(config);
    this->AdditionalCleanFiles(config);
  }
}